

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::thread::id,_void>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
::nosize_transfer_element(void *param_1)

{
  long *in_R8;
  moved_type mVar1;
  destroy_element_on_exit d;
  arrays_type *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffffb0;
  arrays_type *in_stack_ffffffffffffffb8;
  
  *in_R8 = *in_R8 + 1;
  position_for(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  mVar1 = flat_map_types<std::thread::id,_int>::move((element_type *)0x40d563);
  table_core<boost::unordered::detail::foa::flat_map_types<std::thread::id,int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::thread::id,void>,std::equal_to<std::thread::id>,std::allocator<std::pair<std::thread::id_const,int>>>
  ::nosize_unchecked_emplace_at<std::pair<std::thread::id&&,int&&>>
            ((table_core<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::thread::id,_void>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
              *)param_1,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(size_t)mVar1.second,
             (pair<std::thread::id_&&,_int_&&> *)mVar1.first);
  destroy_element_on_exit::~destroy_element_on_exit((destroy_element_on_exit *)0x40d5b1);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }